

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinR2SCANL_X,void>::
eval_exc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinR2SCANL_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  double *eps;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  const_host_buffer_type lapl;
  host_buffer_type eps_00;
  long lVar1;
  double dVar2;
  double sigma_00;
  double dVar3;
  double lapl_00;
  double rho_00;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  lapl = *args_3;
  eps_00 = *args_5;
  if (*(int *)(this + 8) != 0) {
    if (0 < (int)N) {
      lVar1 = 0;
      do {
        lapl_00 = *(double *)((long)lapl + lVar1);
        rho_00 = *(double *)((long)rho + lVar1);
        dVar3 = *(double *)((long)sigma + lVar1);
        dVar2 = 0.0;
        if (1e-15 < rho_00) {
          dVar2 = 1.0000000000000052e-40;
          if (1.0000000000000052e-40 <= dVar3) {
            dVar2 = dVar3;
          }
          dStack_48 = dVar3;
          dStack_40 = rho_00;
          dStack_38 = lapl_00;
          kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar_impl
                    (rho_00,dVar2,lapl_00,0.0,&dStack_50);
          dVar2 = dStack_50;
          dVar3 = dStack_48;
          lapl_00 = dStack_38;
          rho_00 = dStack_40;
        }
        eps = (double *)((long)eps_00 + lVar1);
        dStack_50 = dVar2 * rho_00;
        if (rho_00 <= 1e-11) {
          *eps = 0.0;
        }
        else {
          dVar2 = 4.641588833612795e-30;
          if (4.641588833612795e-30 <= dVar3) {
            dVar2 = dVar3;
          }
          dVar3 = 1e-20;
          if (1e-20 <= dStack_50) {
            dVar3 = dStack_50;
          }
          sigma_00 = rho_00 * 8.0 * dVar3;
          if (dVar2 <= sigma_00) {
            sigma_00 = dVar2;
          }
          kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_unpolar_impl
                    (rho_00,sigma_00,lapl_00,dVar3,eps);
        }
        lVar1 = lVar1 + 8;
      } while ((ulong)N << 3 != lVar1);
    }
    return;
  }
  host_eval_exc_helper_polar<ExchCXX::BuiltinR2SCANL_X>(N,rho,sigma,lapl,*args_4,eps_00);
  return;
}

Assistant:

void eval_exc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }